

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O2

int ps_start_utt(ps_decoder_t *ps)

{
  ps_search_t *ppVar1;
  int iVar2;
  FILE *pFVar3;
  char *pcVar4;
  char *fmt;
  long lVar5;
  char uttid [16];
  
  if ((byte)(ps->acmod->state - 1) < 2) {
    pcVar4 = "Utterance already started\n";
    lVar5 = 0x44a;
LAB_0010a89f:
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
            ,lVar5,pcVar4);
    return -1;
  }
  if (ps->search == (ps_search_t *)0x0) {
    pcVar4 = 
    "No search module is selected, did you forget to specify a language model or grammar?\n";
    lVar5 = 0x450;
    goto LAB_0010a89f;
  }
  ptmr_reset(&ps->perf);
  ptmr_start(&ps->perf);
  sprintf(uttid,"%09u",(ulong)ps->uttno);
  ps->uttno = ps->uttno + 1;
  ps_lattice_free(ps->search->dag);
  ppVar1 = ps->search;
  ppVar1->dag = (ps_lattice_t *)0x0;
  ppVar1->last_link = (ps_latlink_t *)0x0;
  ppVar1->post = 0;
  ckd_free(ppVar1->hyp_str);
  ps->search->hyp_str = (char *)0x0;
  iVar2 = acmod_start_utt(ps->acmod);
  if (iVar2 < 0) {
    return iVar2;
  }
  if (ps->mfclogdir != (char *)0x0) {
    pcVar4 = string_join(ps->mfclogdir,"/",uttid,".mfc",0);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
            ,0x469,"Writing MFCC file: %s\n",pcVar4);
    pFVar3 = fopen(pcVar4,"wb");
    if (pFVar3 == (FILE *)0x0) {
      fmt = "Failed to open MFCC file %s";
      lVar5 = 0x46b;
      goto LAB_0010a8f9;
    }
    ckd_free(pcVar4);
    acmod_set_mfcfh(ps->acmod,(FILE *)pFVar3);
  }
  if (ps->rawlogdir != (char *)0x0) {
    pcVar4 = string_join(ps->rawlogdir,"/",uttid,".raw",0);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
            ,0x476,"Writing raw audio file: %s\n",pcVar4);
    pFVar3 = fopen(pcVar4,"wb");
    if (pFVar3 == (FILE *)0x0) {
      fmt = "Failed to open raw audio file %s";
      lVar5 = 0x478;
      goto LAB_0010a8f9;
    }
    ckd_free(pcVar4);
    acmod_set_rawfh(ps->acmod,(FILE *)pFVar3);
  }
  if (ps->senlogdir != (char *)0x0) {
    pcVar4 = string_join(ps->senlogdir,"/",uttid,".sen",0);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
            ,0x483,"Writing senone score file: %s\n",pcVar4);
    pFVar3 = fopen(pcVar4,"wb");
    if (pFVar3 == (FILE *)0x0) {
      fmt = "Failed to open senone score file %s";
      lVar5 = 0x485;
LAB_0010a8f9:
      err_msg_system(ERR_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
                     ,lVar5,fmt,pcVar4);
      ckd_free(pcVar4);
      return -1;
    }
    ckd_free(pcVar4);
    acmod_set_senfh(ps->acmod,(FILE *)pFVar3);
  }
  ppVar1 = ps->phone_loop;
  if (ppVar1 != (ps_search_t *)0x0) {
    (*ppVar1->vt->start)(ppVar1);
  }
  iVar2 = (*ps->search->vt->start)(ps->search);
  return iVar2;
}

Assistant:

int
ps_start_utt(ps_decoder_t *ps)
{
    int rv;
    char uttid[16];
    
    if (ps->acmod->state == ACMOD_STARTED || ps->acmod->state == ACMOD_PROCESSING) {
	E_ERROR("Utterance already started\n");
	return -1;
    }

    if (ps->search == NULL) {
        E_ERROR("No search module is selected, did you forget to "
                "specify a language model or grammar?\n");
        return -1;
    }

    ptmr_reset(&ps->perf);
    ptmr_start(&ps->perf);

    sprintf(uttid, "%09u", ps->uttno);
    ++ps->uttno;

    /* Remove any residual word lattice and hypothesis. */
    ps_lattice_free(ps->search->dag);
    ps->search->dag = NULL;
    ps->search->last_link = NULL;
    ps->search->post = 0;
    ckd_free(ps->search->hyp_str);
    ps->search->hyp_str = NULL;
    if ((rv = acmod_start_utt(ps->acmod)) < 0)
        return rv;

    /* Start logging features and audio if requested. */
    if (ps->mfclogdir) {
        char *logfn = string_join(ps->mfclogdir, "/",
                                  uttid, ".mfc", NULL);
        FILE *mfcfh;
        E_INFO("Writing MFCC file: %s\n", logfn);
        if ((mfcfh = fopen(logfn, "wb")) == NULL) {
            E_ERROR_SYSTEM("Failed to open MFCC file %s", logfn);
            ckd_free(logfn);
            return -1;
        }
        ckd_free(logfn);
        acmod_set_mfcfh(ps->acmod, mfcfh);
    }
    if (ps->rawlogdir) {
        char *logfn = string_join(ps->rawlogdir, "/",
                                  uttid, ".raw", NULL);
        FILE *rawfh;
        E_INFO("Writing raw audio file: %s\n", logfn);
        if ((rawfh = fopen(logfn, "wb")) == NULL) {
            E_ERROR_SYSTEM("Failed to open raw audio file %s", logfn);
            ckd_free(logfn);
            return -1;
        }
        ckd_free(logfn);
        acmod_set_rawfh(ps->acmod, rawfh);
    }
    if (ps->senlogdir) {
        char *logfn = string_join(ps->senlogdir, "/",
                                  uttid, ".sen", NULL);
        FILE *senfh;
        E_INFO("Writing senone score file: %s\n", logfn);
        if ((senfh = fopen(logfn, "wb")) == NULL) {
            E_ERROR_SYSTEM("Failed to open senone score file %s", logfn);
            ckd_free(logfn);
            return -1;
        }
        ckd_free(logfn);
        acmod_set_senfh(ps->acmod, senfh);
    }

    /* Start auxiliary phone loop search. */
    if (ps->phone_loop)
        ps_search_start(ps->phone_loop);

    return ps_search_start(ps->search);
}